

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateByteSize
          (MessageGenerator *this,Printer *printer)

{
  pointer *pppFVar1;
  FieldDescriptor FVar2;
  Descriptor *pDVar3;
  pointer ppFVar4;
  cpp *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *field;
  iterator __position;
  pointer puVar5;
  __uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
  _Var6;
  iterator __position_00;
  undefined4 uVar7;
  pointer pvVar8;
  bool bVar9;
  FileOptions_OptimizeMode FVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  FieldGenerator *pFVar14;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *pvVar15;
  LogMessage *pLVar16;
  pointer ppFVar17;
  AnnotationCollector *pAVar18;
  long lVar19;
  long lVar20;
  uint32_t uVar21;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *extraout_RDX_00;
  FieldDescriptor *pFVar22;
  FieldDescriptor *field_00;
  pointer puVar23;
  byte bVar24;
  int iVar25;
  uint uVar26;
  iterator __first;
  char *format_00;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_01;
  int *in_R8;
  size_type in_R9;
  AnnotationCollector *pAVar27;
  Options *pOVar28;
  ulong uVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  Hex hex;
  StringPiece has_bits_var;
  int cached_has_word_index;
  Formatter format;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  chunks;
  string chunk_mask_str;
  vector<unsigned_int,_std::allocator<unsigned_int>_> masks_for_has_bits;
  Iterator __begin4;
  ColdChunkSkipper cold_skipper;
  Iterator __end4;
  Iterator __end3;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  undefined1 local_234 [16];
  undefined4 local_224;
  Formatter local_220;
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  Options *local_1b0;
  FieldGeneratorMap *local_1a8;
  undefined1 local_1a0 [16];
  undefined1 local_190 [56];
  undefined1 local_158 [8];
  undefined1 local_150 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  _Base_ptr local_130;
  _Base_ptr local_128;
  AnnotationCollector *local_f8;
  Iterator local_f0;
  Iterator local_e0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_d0;
  LogMessage local_a0;
  LogMessage local_68;
  
  pDVar3 = this->descriptor_;
  pOVar28 = &this->options_;
  local_234._4_8_ = printer;
  FVar10 = GetOptimizeFor(*(FileDescriptor **)(pDVar3 + 0x10),pOVar28,(bool *)0x0);
  if (((FVar10 != FileOptions_OptimizeMode_LITE_RUNTIME) && (*(int *)(pDVar3 + 0x78) == 0)) &&
     (*(int *)(pDVar3 + 4) == 0)) {
    return;
  }
  local_220.printer_ = (Printer *)local_234._4_8_;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::_Rb_tree(&local_220.vars_._M_t,&(this->variables_)._M_t);
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x48) == '\x01') {
    local_140._8_8_ = local_150 + 8;
    local_150._8_4_ = _S_red;
    local_140._M_allocated_capacity = 0;
    local_128 = (_Base_ptr)0x0;
    local_130 = (_Base_ptr)local_140._8_8_;
    SetUnknownFieldsVariable
              (this->descriptor_,pOVar28,
               (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_150);
    Formatter::AddMap(&local_220,
                      (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)local_150);
    Formatter::operator()<>
              (&local_220,
               "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n  size_t total_size = _extensions_.MessageSetByteSize();\n  if ($have_unknown_fields$) {\n    total_size += ::$proto_ns$::internal::\n        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n  }\n  int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n  SetCachedSize(cached_size);\n  return total_size;\n}\n"
              );
    this_01 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)local_150;
    goto LAB_002ab7c2;
  }
  local_1b0 = pOVar28;
  if (1 < this->num_required_fields_) {
    Formatter::operator()<>
              (&local_220,
               "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n// @@protoc_insertion_point(required_fields_byte_size_fallback_start:$full_name$)\n"
              );
    io::Printer::Indent(local_220.printer_);
    Formatter::operator()<>(&local_220,"size_t total_size = 0;\n");
    ppFVar17 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar17 != ppFVar4) {
      pFVar22 = extraout_RDX;
      do {
        this_00 = (cpp *)*ppFVar17;
        if (((byte)this_00[1] & 0x60) == 0x40) {
          FieldName_abi_cxx11_((string *)local_150,this_00,pFVar22);
          Formatter::operator()(&local_220,"\nif (_internal_has_$1$()) {\n",(string *)local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._0_8_ != &local_140) {
            operator_delete((void *)local_150._0_8_);
          }
          io::Printer::Indent(local_220.printer_);
          PrintFieldComment<google::protobuf::FieldDescriptor>
                    (&local_220,(FieldDescriptor *)this_00);
          pFVar14 = FieldGeneratorMap::get(&this->field_generators_,(FieldDescriptor *)this_00);
          (*pFVar14->_vptr_FieldGenerator[0x14])(pFVar14,local_234._4_8_);
          io::Printer::Outdent(local_220.printer_);
          Formatter::operator()<>(&local_220,"}\n");
          pFVar22 = extraout_RDX_00;
        }
        ppFVar17 = ppFVar17 + 1;
      } while (ppFVar17 != ppFVar4);
    }
    Formatter::operator()<>(&local_220,"\nreturn total_size;\n");
    pOVar28 = local_1b0;
    io::Printer::Outdent(local_220.printer_);
    Formatter::operator()<>(&local_220,"}\n");
  }
  Formatter::operator()<>
            (&local_220,
             "size_t $classname$::ByteSizeLong() const {\n$annotate_bytesize$// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n"
            );
  io::Printer::Indent(local_220.printer_);
  Formatter::operator()<>(&local_220,"size_t total_size = 0;\n\n");
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    Formatter::operator()<>(&local_220,"total_size += _extensions_.ByteSize();\n\n");
  }
  local_d0._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_d0._M_impl.super__Rb_tree_header._M_header;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_d0._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d0._M_impl.super__Rb_tree_header._M_header._M_right =
       local_d0._M_impl.super__Rb_tree_header._M_header._M_left;
  SetUnknownFieldsVariable
            (this->descriptor_,pOVar28,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_d0);
  Formatter::AddMap(&local_220,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)&local_d0);
  if (this->num_required_fields_ < 2) {
    ppFVar17 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar17 != ppFVar4) {
      do {
        pFVar22 = *ppFVar17;
        if (((byte)pFVar22[1] & 0x60) == 0x40) {
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_220,pFVar22);
          FieldName_abi_cxx11_((string *)local_150,(cpp *)pFVar22,field_00);
          Formatter::operator()(&local_220,"if (_internal_has_$1$()) {\n",(string *)local_150);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._0_8_ != &local_140) {
            operator_delete((void *)local_150._0_8_);
          }
          io::Printer::Indent(local_220.printer_);
          pFVar14 = FieldGeneratorMap::get(&this->field_generators_,pFVar22);
          (*pFVar14->_vptr_FieldGenerator[0x14])(pFVar14,local_234._4_8_);
          io::Printer::Outdent(local_220.printer_);
          Formatter::operator()<>(&local_220,"}\n");
        }
        ppFVar17 = ppFVar17 + 1;
      } while (ppFVar17 != ppFVar4);
    }
  }
  else {
    RequiredFieldsBitMask((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_1a0,this);
    has_bits_var.length_ = in_R9;
    has_bits_var.ptr_ = (char *)0xa;
    in_R8 = (int *)0xa;
    (anonymous_namespace)::ConditionalToCheckBitmasks_abi_cxx11_
              ((string *)local_150,(_anonymous_namespace_ *)local_1a0,
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x1,true,has_bits_var);
    Formatter::operator()
              (&local_220,"if ($1$) {  // All required fields are present.\n",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._0_8_ != &local_140) {
      operator_delete((void *)local_150._0_8_);
    }
    io::Printer::Indent(local_220.printer_);
    ppFVar17 = (this->optimized_order_).
               super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
               ._M_impl.super__Vector_impl_data._M_start;
    ppFVar4 = (this->optimized_order_).
              super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
              ._M_impl.super__Vector_impl_data._M_finish;
    if (ppFVar17 != ppFVar4) {
      do {
        pFVar22 = *ppFVar17;
        if (((byte)pFVar22[1] & 0x60) == 0x40) {
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_220,pFVar22);
          pFVar14 = FieldGeneratorMap::get(&this->field_generators_,pFVar22);
          (*pFVar14->_vptr_FieldGenerator[0x14])(pFVar14,local_234._4_8_);
          Formatter::operator()<>(&local_220,"\n");
        }
        ppFVar17 = ppFVar17 + 1;
      } while (ppFVar17 != ppFVar4);
    }
    io::Printer::Outdent(local_220.printer_);
    Formatter::operator()<>
              (&local_220,"} else {\n  total_size += RequiredFieldsByteSizeFallback();\n}\n");
    if ((Printer *)local_1a0._0_8_ != (Printer *)0x0) {
      operator_delete((void *)local_1a0._0_8_);
    }
  }
  local_1e8.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  local_1e8.
  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        *)0x0;
  ppFVar4 = (this->optimized_order_).
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  __position_00._M_current =
       local_1e8.
       super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  for (ppFVar17 = (this->optimized_order_).
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
      local_1e8.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current, ppFVar17 != ppFVar4;
      ppFVar17 = ppFVar17 + 1) {
    field = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*ppFVar17;
    local_150._0_8_ = field;
    if ((local_1e8.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start == __position_00._M_current) ||
       (pFVar22 = __position_00._M_current[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1],
       (((byte)*(FieldDescriptor *)(field->_M_local_buf + 1) ^ (byte)pFVar22[1]) & 0x60) != 0)) {
LAB_002aae35:
      if (__position_00._M_current ==
          local_1e8.
          super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ::_M_realloc_insert<>(&local_1e8,__position_00);
      }
      else {
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        ((__position_00._M_current)->
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        local_1e8.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish =
             local_1e8.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish + 1;
      }
    }
    else {
      iVar11 = HasBitIndex(this,pFVar22);
      iVar25 = iVar11 + 7;
      if (-1 < iVar11) {
        iVar25 = iVar11;
      }
      iVar25 = iVar25 >> 3;
      if (iVar11 == -1) {
        iVar25 = -1;
      }
      iVar12 = HasBitIndex(this,(FieldDescriptor *)field->_M_local_buf);
      iVar11 = iVar12 + 7;
      if (-1 < iVar12) {
        iVar11 = iVar12;
      }
      iVar11 = iVar11 >> 3;
      if (iVar12 == -1) {
        iVar11 = -1;
      }
      if (iVar25 != iVar11) goto LAB_002aae35;
    }
    __position._M_current =
         local_1e8.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish[-1].
         super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        local_1e8.
        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish[-1].
        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
      ::_M_realloc_insert<google::protobuf::FieldDescriptor_const*const&>
                ((vector<google::protobuf::FieldDescriptor_const*,std::allocator<google::protobuf::FieldDescriptor_const*>>
                  *)(local_1e8.
                     super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1),__position,
                 (FieldDescriptor **)local_150);
    }
    else {
      *__position._M_current = (FieldDescriptor *)local_150._0_8_;
      pppFVar1 = &local_1e8.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish[-1].
                  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppFVar1 = *pppFVar1 + 1;
    }
    __position_00._M_current =
         local_1e8.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
  }
  lVar19 = ((long)__position_00._M_current -
            (long)local_1e8.
                  super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 >> 2;
  pvVar15 = local_1e8.
            super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (0 < lVar19) {
    pvVar15 = local_1e8.
              super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start + lVar19 * 4;
    lVar19 = lVar19 + 1;
    __first._M_current =
         local_1e8.
         super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start + 2;
    do {
      if (((byte)(*__first._M_current[-2].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + -2;
        goto LAB_002aafbd;
      }
      if (((byte)(*__first._M_current[-1].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + -1;
        goto LAB_002aafbd;
      }
      if (((byte)(*((__first._M_current)->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40)
      goto LAB_002aafbd;
      if (((byte)(*__first._M_current[1].
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   ._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) == 0x40) {
        __first._M_current = __first._M_current + 1;
        goto LAB_002aafbd;
      }
      lVar19 = lVar19 + -1;
      __first._M_current = __first._M_current + 4;
    } while (1 < lVar19);
  }
  lVar19 = ((long)__position_00._M_current - (long)pvVar15 >> 3) * -0x5555555555555555;
  if (lVar19 == 1) {
LAB_002aaf95:
    __first._M_current = pvVar15;
    if (((byte)(*(pvVar15->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
      __first._M_current = __position_00._M_current;
    }
  }
  else if (lVar19 == 2) {
LAB_002aaf80:
    __first._M_current = pvVar15;
    if (((byte)(*(pvVar15->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
      pvVar15 = pvVar15 + 1;
      goto LAB_002aaf95;
    }
  }
  else {
    __first._M_current = __position_00._M_current;
    if ((lVar19 == 3) &&
       (__first._M_current = pvVar15,
       ((byte)(*(pvVar15->
                super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40)) {
      pvVar15 = pvVar15 + 1;
      goto LAB_002aaf80;
    }
  }
LAB_002aafbd:
  pvVar15 = __first._M_current + 1;
  if (pvVar15 != __position_00._M_current && __first._M_current != __position_00._M_current) {
    do {
      if (((byte)(*(pvVar15->
                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                   )._M_impl.super__Vector_impl_data._M_start)[1] & 0x60) != 0x40) {
        std::
        vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
        ::_M_move_assign(__first._M_current,pvVar15);
        __first._M_current = __first._M_current + 1;
      }
      pvVar15 = pvVar15 + 1;
    } while (pvVar15 != __position_00._M_current);
  }
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::_M_erase(&local_1e8,__first,
             (iterator)
             local_1e8.
             super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  local_190._40_8_ = &this->has_bit_indices_;
  anon_unknown_0::ColdChunkSkipper::ColdChunkSkipper
            ((ColdChunkSkipper *)local_150,local_1b0,&local_1e8,
             (vector<int,_std::allocator<int>_> *)local_190._40_8_,
             (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  local_234._0_4_ = -1;
  Formatter::operator()<>
            (&local_220,
             "$uint32$ cached_has_bits = 0;\n// Prevent compiler warnings about cached_has_bits being unused\n(void) cached_has_bits;\n\n"
            );
  if (local_1e8.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_1e8.
      super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    local_1a8 = &this->field_generators_;
    pAVar27 = (AnnotationCollector *)0x0;
    do {
      pvVar8 = local_1e8.
               super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppFVar17 = local_1e8.
                 super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[(long)pAVar27].
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)local_1e8.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start[(long)pAVar27].
                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar17) < 9) {
        local_224 = 0;
      }
      else {
        iVar25 = HasBitIndex(this,*ppFVar17);
        local_224 = CONCAT31((int3)(iVar25 + 0x1fU >> 8),iVar25 + 0x1fU < 0xffffffe0 && iVar25 != -1
                            );
      }
      local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d0,"");
      local_1a0._0_8_ = local_234._4_8_;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(local_1a0 + 8),
                 (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_130);
      local_f8 = pAVar27;
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(local_1a0 + 8));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
        operator_delete(local_1d0._M_dataplus._M_p);
      }
      pvVar15 = pvVar8 + (long)pAVar27;
      if ((char)local_224 != '\0') {
        uVar13 = anon_unknown_0::GenChunkMask
                           (pvVar15,(vector<int,_std::allocator<int>_> *)local_190._40_8_);
        hex.value = (ulong)uVar13;
        hex._8_8_ = 8;
        strings::AlphaNum::AlphaNum((AlphaNum *)local_1a0,hex);
        local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1d0,local_1a0._0_8_,(pointer)(local_1a0._8_8_ + local_1a0._0_8_)
                  );
        if (uVar13 == 0) {
          bVar9 = true;
        }
        else {
          iVar25 = 0;
          uVar21 = uVar13;
          do {
            iVar25 = iVar25 + (uVar21 & 1);
            bVar9 = 1 < uVar21;
            uVar21 = uVar21 >> 1;
          } while (bVar9);
          bVar9 = iVar25 < 2;
        }
        if (bVar9) {
          internal::LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1127);
          pLVar16 = internal::LogMessage::operator<<
                              (&local_68,"CHECK failed: (2) <= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1a0,pLVar16);
          internal::LogMessage::~LogMessage(&local_68);
        }
        uVar26 = 0;
        if (uVar13 != 0) {
          do {
            uVar26 = uVar26 + (uVar13 & 1);
            bVar9 = 1 < uVar13;
            uVar13 = uVar13 >> 1;
          } while (bVar9);
          uVar26 = (uint)(8 < (int)uVar26);
        }
        if ((char)uVar26 != '\0') {
          internal::LogMessage::LogMessage
                    (&local_a0,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/cpp/cpp_message.cc"
                     ,0x1128);
          pLVar16 = internal::LogMessage::operator<<
                              (&local_a0,"CHECK failed: (8) >= (popcnt(chunk_mask)): ");
          internal::LogFinisher::operator=((LogFinisher *)local_1a0,pLVar16);
          internal::LogMessage::~LogMessage(&local_a0);
        }
        uVar7 = local_234._0_4_;
        iVar11 = HasBitIndex(this,*(pvVar15->
                                   super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                   )._M_impl.super__Vector_impl_data._M_start);
        iVar25 = iVar11 + 0x1f;
        if (-1 < iVar11) {
          iVar25 = iVar11;
        }
        iVar25 = iVar25 >> 5;
        if (iVar11 == -1) {
          iVar25 = -1;
        }
        if (uVar7 != iVar25) {
          local_234._0_4_ = iVar25;
          Formatter::operator()(&local_220,"cached_has_bits = _has_bits_[$1$];\n",(int *)local_234);
        }
        Formatter::operator()(&local_220,"if (cached_has_bits & 0x$1$u) {\n",&local_1d0);
        io::Printer::Indent(local_220.printer_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
          operator_delete(local_1d0._M_dataplus._M_p);
        }
      }
      ppFVar17 = (pvVar15->
                 super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                 )._M_impl.super__Vector_impl_data._M_start;
      if ((pvVar15->
          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          )._M_impl.super__Vector_impl_data._M_finish != ppFVar17) {
        uVar29 = 0;
        do {
          pFVar22 = ppFVar17[uVar29];
          pFVar14 = FieldGeneratorMap::get(local_1a8,pFVar22);
          PrintFieldComment<google::protobuf::FieldDescriptor>(&local_220,pFVar22);
          FVar2 = pFVar22[1];
          bVar24 = (byte)FVar2 & 0x60;
          if (bVar24 == 0x60) {
            bVar9 = false;
          }
          else {
            if (((byte)FVar2 & 2) == 0) {
              if ((bVar24 == 0x20) && (*(char *)(*(long *)(pFVar22 + 0x10) + 0x3a) == '\x02')) {
                if ((((byte)FVar2 & 0x10) == 0) || (*(long *)(pFVar22 + 0x28) == 0))
                goto LAB_002ab35e;
              }
              else if (bVar24 == 0x40) goto LAB_002ab35e;
            }
            else {
LAB_002ab35e:
              if (*(char *)(*(long *)(pFVar22 + 0x38) + 0x4f) == '\0') {
                bVar9 = true;
                anon_unknown_0::PrintPresenceCheck
                          (&local_220,pFVar22,(vector<int,_std::allocator<int>_> *)local_190._40_8_,
                           (Printer *)local_234,in_R8);
                goto LAB_002ab3e1;
              }
            }
            local_1a0._0_8_ = local_190;
            std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"this->","");
            bVar9 = anon_unknown_0::EmitFieldNonDefaultCondition
                              ((Printer *)local_234._4_8_,(string *)local_1a0,pFVar22);
            if ((Printer *)local_1a0._0_8_ != (Printer *)local_190) {
              operator_delete((void *)local_1a0._0_8_);
            }
          }
LAB_002ab3e1:
          (*pFVar14->_vptr_FieldGenerator[0x14])(pFVar14,local_234._4_8_);
          if (bVar9 != false) {
            io::Printer::Outdent(local_220.printer_);
            Formatter::operator()<>(&local_220,"}\n\n");
          }
          if (bVar24 == 0x60) {
            Formatter::operator()<>(&local_220,"\n");
          }
          uVar29 = uVar29 + 1;
          ppFVar17 = (pvVar15->
                     super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_start;
        } while (uVar29 < (ulong)((long)(pvVar15->
                                        super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppFVar17
                                 >> 3));
      }
      pAVar27 = local_f8;
      if ((char)local_224 != '\0') {
        io::Printer::Outdent(local_220.printer_);
        Formatter::operator()<>(&local_220,"}\n");
      }
      bVar9 = anon_unknown_0::ColdChunkSkipper::OnEndChunk
                        ((ColdChunkSkipper *)local_150,(int)pAVar27,(Printer *)local_234._4_8_);
      if (bVar9) {
        local_234._0_4_ = -1;
      }
      pAVar27 = (AnnotationCollector *)((long)&pAVar27->_vptr_AnnotationCollector + 1);
      pAVar18 = (AnnotationCollector *)
                (((long)local_1e8.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)local_1e8.
                        super__Vector_base<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
    } while (pAVar27 <= pAVar18 && (long)pAVar18 - (long)pAVar27 != 0);
  }
  local_1d0._M_string_length = (size_type)this->descriptor_;
  local_1d0._M_dataplus._M_p = local_1d0._M_dataplus._M_p & 0xffffffff00000000;
  local_e0.idx = *(int *)(local_1d0._M_string_length + 0x6c);
  local_e0.descriptor = (Descriptor *)local_1d0._M_string_length;
  while (bVar9 = operator==((Iterator *)&local_1d0,&local_e0), pOVar28 = local_1b0, !bVar9) {
    lVar20 = (long)(int)local_1d0._M_dataplus._M_p;
    lVar19 = *(long *)(local_1d0._M_string_length + 0x30);
    Formatter::operator()
              (&local_220,"switch ($1$_case()) {\n",
               *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                (lVar19 + 8 + lVar20 * 0x28));
    io::Printer::Indent(local_220.printer_);
    local_1a8 = (FieldGeneratorMap *)(lVar20 * 0x28 + lVar19);
    local_190._48_4_ = 0;
    local_f0.idx = *(int *)((long)&local_1a8->descriptor_ + 4);
    local_158 = (undefined1  [8])local_1a8;
    local_f0.descriptor = (OneofDescriptor *)local_1a8;
    while (bVar9 = operator==((Iterator *)(local_190 + 0x30),&local_f0), !bVar9) {
      pFVar22 = (FieldDescriptor *)
                ((((_Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    *)&((FieldGeneratorMap *)((long)local_158 + 0x20))->descriptor_)->_M_impl).
                 super__Vector_impl_data._M_start + (long)(int)local_190._48_4_ * 9);
      PrintFieldComment<google::protobuf::FieldDescriptor>(&local_220,pFVar22);
      UnderscoresToCamelCase((string *)local_1a0,*(string **)(pFVar22 + 8),true);
      Formatter::operator()(&local_220,"case k$1$: {\n",(string *)local_1a0);
      if ((Printer *)local_1a0._0_8_ != (Printer *)local_190) {
        operator_delete((void *)local_1a0._0_8_);
      }
      io::Printer::Indent(local_220.printer_);
      pFVar14 = FieldGeneratorMap::get(&this->field_generators_,pFVar22);
      (*pFVar14->_vptr_FieldGenerator[0x14])(pFVar14,local_234._4_8_);
      Formatter::operator()<>(&local_220,"break;\n");
      io::Printer::Outdent(local_220.printer_);
      Formatter::operator()<>(&local_220,"}\n");
      local_190._48_4_ = local_190._48_4_ + 1;
    }
    puVar5 = (local_1a8->field_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    _Var6._M_t.
    super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
    .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>._M_head_impl =
         (puVar5->_M_t).
         super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
         ._M_t;
    local_1a0._0_8_ = (Printer *)local_190;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_1a0,
               _Var6._M_t.
               super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
               .super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>.
               _M_head_impl,
               (long)puVar5[1]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::cpp::FieldGenerator,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
                     ._M_t +
               (long)_Var6._M_t.
                     super__Tuple_impl<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_std::default_delete<google::protobuf::compiler::cpp::FieldGenerator>_>
                     .
                     super__Head_base<0UL,_google::protobuf::compiler::cpp::FieldGenerator_*,_false>
                     ._M_head_impl);
    if ((pointer)local_1a0._8_8_ != (pointer)0x0) {
      puVar23 = (pointer)0x0;
      do {
        if ((byte)(*(char *)(local_1a0._0_8_ + (long)puVar23) + 0x9fU) < 0x1a) {
          *(char *)(local_1a0._0_8_ + (long)puVar23) =
               *(char *)(local_1a0._0_8_ + (long)puVar23) + -0x20;
        }
        puVar23 = (pointer)((long)puVar23 + 1);
      } while ((pointer)local_1a0._8_8_ != puVar23);
    }
    Formatter::operator()(&local_220,"case $1$_NOT_SET: {\n  break;\n}\n",(string *)local_1a0);
    if ((Printer *)local_1a0._0_8_ != (Printer *)local_190) {
      operator_delete((void *)local_1a0._0_8_);
    }
    io::Printer::Outdent(local_220.printer_);
    Formatter::operator()<>(&local_220,"}\n");
    local_1d0._M_dataplus._M_p._0_4_ = (int)local_1d0._M_dataplus._M_p + 1;
  }
  if (this->num_weak_fields_ != 0) {
    Formatter::operator()<>(&local_220,"total_size += _weak_field_map_.ByteSizeLong();\n");
  }
  FVar10 = GetOptimizeFor(*(FileDescriptor **)(this->descriptor_ + 0x10),pOVar28,(bool *)0x0);
  if (FVar10 == FileOptions_OptimizeMode_LITE_RUNTIME) {
    Formatter::operator()<>(&local_220,"if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    Formatter::operator()<>(&local_220,"  total_size += $unknown_fields$.size();\n");
    Formatter::operator()<>(&local_220,"}\n");
    format_00 = 
    "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\nSetCachedSize(cached_size);\nreturn total_size;\n"
    ;
  }
  else {
    format_00 = "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n";
  }
  Formatter::operator()<>(&local_220,format_00);
  io::Printer::Outdent(local_220.printer_);
  Formatter::operator()<>(&local_220,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_130);
  std::
  vector<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>,_std::allocator<std::vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>_>_>
  ::~vector(&local_1e8);
  this_01 = &local_d0;
LAB_002ab7c2:
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(this_01);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_220.vars_._M_t);
  return;
}

Assistant:

void MessageGenerator::GenerateByteSize(io::Printer* printer) {
  if (HasSimpleBaseClass(descriptor_, options_)) return;
  Formatter format(printer, variables_);

  if (descriptor_->options().message_set_wire_format()) {
    // Special-case MessageSet.
    std::map<std::string, std::string> vars;
    SetUnknownFieldsVariable(descriptor_, options_, &vars);
    format.AddMap(vars);
    format(
        "size_t $classname$::ByteSizeLong() const {\n"
        "$annotate_bytesize$"
        "// @@protoc_insertion_point(message_set_byte_size_start:$full_name$)\n"
        "  size_t total_size = _extensions_.MessageSetByteSize();\n"
        "  if ($have_unknown_fields$) {\n"
        "    total_size += ::$proto_ns$::internal::\n"
        "        ComputeUnknownMessageSetItemsSize($unknown_fields$);\n"
        "  }\n"
        "  int cached_size = "
        "::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "  SetCachedSize(cached_size);\n"
        "  return total_size;\n"
        "}\n");
    return;
  }

  if (num_required_fields_ > 1) {
    // Emit a function (rarely used, we hope) that handles the required fields
    // by checking for each one individually.
    format(
        "size_t $classname$::RequiredFieldsByteSizeFallback() const {\n"
        "// @@protoc_insertion_point(required_fields_byte_size_fallback_start:"
        "$full_name$)\n");
    format.Indent();
    format("size_t total_size = 0;\n");
    for (auto field : optimized_order_) {
      if (field->is_required()) {
        format(
            "\n"
            "if (_internal_has_$1$()) {\n",
            FieldName(field));
        format.Indent();
        PrintFieldComment(format, field);
        field_generators_.get(field).GenerateByteSize(printer);
        format.Outdent();
        format("}\n");
      }
    }
    format(
        "\n"
        "return total_size;\n");
    format.Outdent();
    format("}\n");
  }

  format(
      "size_t $classname$::ByteSizeLong() const {\n"
      "$annotate_bytesize$"
      "// @@protoc_insertion_point(message_byte_size_start:$full_name$)\n");
  format.Indent();
  format(
      "size_t total_size = 0;\n"
      "\n");

  if (descriptor_->extension_range_count() > 0) {
    format(
        "total_size += _extensions_.ByteSize();\n"
        "\n");
  }

  std::map<std::string, std::string> vars;
  SetUnknownFieldsVariable(descriptor_, options_, &vars);
  format.AddMap(vars);

  // Handle required fields (if any).  We expect all of them to be
  // present, so emit one conditional that checks for that.  If they are all
  // present then the fast path executes; otherwise the slow path executes.
  if (num_required_fields_ > 1) {
    // The fast path works if all required fields are present.
    const std::vector<uint32_t> masks_for_has_bits = RequiredFieldsBitMask();
    format("if ($1$) {  // All required fields are present.\n",
           ConditionalToCheckBitmasks(masks_for_has_bits));
    format.Indent();
    // Oneof fields cannot be required, so optimized_order_ contains all of the
    // fields that we need to potentially emit.
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      field_generators_.get(field).GenerateByteSize(printer);
      format("\n");
    }
    format.Outdent();
    format(
        "} else {\n"  // the slow path
        "  total_size += RequiredFieldsByteSizeFallback();\n"
        "}\n");
  } else {
    // num_required_fields_ <= 1: no need to be tricky
    for (auto field : optimized_order_) {
      if (!field->is_required()) continue;
      PrintFieldComment(format, field);
      format("if (_internal_has_$1$()) {\n", FieldName(field));
      format.Indent();
      field_generators_.get(field).GenerateByteSize(printer);
      format.Outdent();
      format("}\n");
    }
  }

  std::vector<std::vector<const FieldDescriptor*>> chunks = CollectFields(
      optimized_order_,
      [&](const FieldDescriptor* a, const FieldDescriptor* b) -> bool {
        return a->label() == b->label() && HasByteIndex(a) == HasByteIndex(b);
      });

  // Remove chunks with required fields.
  chunks.erase(std::remove_if(chunks.begin(), chunks.end(), IsRequired),
               chunks.end());

  ColdChunkSkipper cold_skipper(options_, chunks, has_bit_indices_, kColdRatio);
  int cached_has_word_index = -1;

  format(
      "$uint32$ cached_has_bits = 0;\n"
      "// Prevent compiler warnings about cached_has_bits being unused\n"
      "(void) cached_has_bits;\n\n");

  for (int chunk_index = 0; chunk_index < chunks.size(); chunk_index++) {
    const std::vector<const FieldDescriptor*>& chunk = chunks[chunk_index];
    const bool have_outer_if =
        chunk.size() > 1 && HasWordIndex(chunk[0]) != kNoHasbit;
    cold_skipper.OnStartChunk(chunk_index, cached_has_word_index, "", printer);

    if (have_outer_if) {
      // Emit an if() that will let us skip the whole chunk if none are set.
      uint32_t chunk_mask = GenChunkMask(chunk, has_bit_indices_);
      std::string chunk_mask_str =
          StrCat(strings::Hex(chunk_mask, strings::ZERO_PAD_8));

      // Check (up to) 8 has_bits at a time if we have more than one field in
      // this chunk.  Due to field layout ordering, we may check
      // _has_bits_[last_chunk * 8 / 32] multiple times.
      GOOGLE_DCHECK_LE(2, popcnt(chunk_mask));
      GOOGLE_DCHECK_GE(8, popcnt(chunk_mask));

      if (cached_has_word_index != HasWordIndex(chunk.front())) {
        cached_has_word_index = HasWordIndex(chunk.front());
        format("cached_has_bits = _has_bits_[$1$];\n", cached_has_word_index);
      }
      format("if (cached_has_bits & 0x$1$u) {\n", chunk_mask_str);
      format.Indent();
    }

    // Go back and emit checks for each of the fields we processed.
    for (int j = 0; j < chunk.size(); j++) {
      const FieldDescriptor* field = chunk[j];
      const FieldGenerator& generator = field_generators_.get(field);
      bool have_enclosing_if = false;
      bool need_extra_newline = false;

      PrintFieldComment(format, field);

      if (field->is_repeated()) {
        // No presence check is required.
        need_extra_newline = true;
      } else if (HasHasbit(field)) {
        PrintPresenceCheck(format, field, has_bit_indices_, printer,
                           &cached_has_word_index);
        have_enclosing_if = true;
      } else {
        // Without field presence: field is serialized only if it has a
        // non-default value.
        have_enclosing_if =
            EmitFieldNonDefaultCondition(printer, "this->", field);
      }

      generator.GenerateByteSize(printer);

      if (have_enclosing_if) {
        format.Outdent();
        format(
            "}\n"
            "\n");
      }
      if (need_extra_newline) {
        format("\n");
      }
    }

    if (have_outer_if) {
      format.Outdent();
      format("}\n");
    }

    if (cold_skipper.OnEndChunk(chunk_index, printer)) {
      // Reset here as it may have been updated in just closed if statement.
      cached_has_word_index = -1;
    }
  }

  // Fields inside a oneof don't use _has_bits_ so we count them in a separate
  // pass.
  for (auto oneof : OneOfRange(descriptor_)) {
    format("switch ($1$_case()) {\n", oneof->name());
    format.Indent();
    for (auto field : FieldRange(oneof)) {
      PrintFieldComment(format, field);
      format("case k$1$: {\n", UnderscoresToCamelCase(field->name(), true));
      format.Indent();
      if (!IsFieldStripped(field, options_)) {
        field_generators_.get(field).GenerateByteSize(printer);
      }
      format("break;\n");
      format.Outdent();
      format("}\n");
    }
    format(
        "case $1$_NOT_SET: {\n"
        "  break;\n"
        "}\n",
        ToUpper(oneof->name()));
    format.Outdent();
    format("}\n");
  }

  if (num_weak_fields_) {
    // TagSize + MessageSize
    format("total_size += _weak_field_map_.ByteSizeLong();\n");
  }

  if (UseUnknownFieldSet(descriptor_->file(), options_)) {
    // We go out of our way to put the computation of the uncommon path of
    // unknown fields in tail position. This allows for better code generation
    // of this function for simple protos.
    format(
        "return MaybeComputeUnknownFieldsSize(total_size, &_cached_size_);\n");
  } else {
    format("if (PROTOBUF_PREDICT_FALSE($have_unknown_fields$)) {\n");
    format("  total_size += $unknown_fields$.size();\n");
    format("}\n");

    // We update _cached_size_ even though this is a const method.  Because
    // const methods might be called concurrently this needs to be atomic
    // operations or the program is undefined.  In practice, since any
    // concurrent writes will be writing the exact same value, normal writes
    // will work on all common processors. We use a dedicated wrapper class to
    // abstract away the underlying atomic. This makes it easier on platforms
    // where even relaxed memory order might have perf impact to replace it with
    // ordinary loads and stores.
    format(
        "int cached_size = ::$proto_ns$::internal::ToCachedSize(total_size);\n"
        "SetCachedSize(cached_size);\n"
        "return total_size;\n");
  }

  format.Outdent();
  format("}\n");
}